

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

bool LoadCertificate(UniquePtr<X509> *out_x509,UniquePtr<struct_stack_st_X509> *out_chain,
                    string *file)

{
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  int iVar3;
  BIO_METHOD *type;
  BIO *pBVar4;
  pointer bio_00;
  char *filename;
  X509 *pXVar5;
  stack_st_X509 *__p;
  pointer sk;
  ulong uVar6;
  uint32_t err;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_48;
  UniquePtr<X509> cert;
  unique_ptr<bio_st,_bssl::internal::Deleter> local_30;
  UniquePtr<BIO> bio;
  string *file_local;
  UniquePtr<struct_stack_st_X509> *out_chain_local;
  UniquePtr<X509> *out_x509_local;
  
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)file;
  type = BIO_s_file();
  pBVar4 = BIO_new(type);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&local_30,(pointer)pBVar4);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_30);
  if (bVar1) {
    bio_00 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_30);
    filename = (char *)std::__cxx11::string::c_str();
    iVar3 = BIO_read_filename(bio_00,filename);
    if (iVar3 != 0) {
      pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_30);
      pXVar5 = PEM_read_bio_X509(pBVar4,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::reset(out_x509,(pointer)pXVar5);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)out_x509);
      if (bVar1) {
        __p = sk_X509_new_null();
        std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::reset(out_chain,__p);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)out_chain);
        if (bVar1) {
          do {
            pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_30);
            pXVar5 = PEM_read_bio_X509(pBVar4,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            std::unique_ptr<x509_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<x509_st,bssl::internal::Deleter> *)&local_48,(pointer)pXVar5);
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_48);
            if (bVar1) {
              sk = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(out_chain);
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffb0,
                         &local_48);
              eVar2 = bssl::PushToStack<stack_st_X509>
                                (sk,(unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &stack0xffffffffffffffb0);
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&stack0xffffffffffffffb0);
              if (((eVar2 ^ 0xffU) & 1) == 0) {
                cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 0;
              }
              else {
                out_x509_local._7_1_ = 0;
                cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 1;
              }
            }
            else {
              cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_48);
          } while ((int)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == 0);
          if ((int)cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl == 2) {
            uVar6 = ERR_peek_last_error();
            iVar3 = ERR_GET_LIB((uint32_t)uVar6);
            if ((iVar3 == 9) && (iVar3 = ERR_GET_REASON((uint32_t)uVar6), iVar3 == 0x6e)) {
              ERR_clear_error();
              out_x509_local._7_1_ = 1;
              cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              out_x509_local._7_1_ = 0;
              cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 1;
            }
          }
        }
        else {
          out_x509_local._7_1_ = 0;
          cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 1;
        }
      }
      else {
        out_x509_local._7_1_ = 0;
        cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 1;
      }
      goto LAB_00131ac6;
    }
  }
  out_x509_local._7_1_ = 0;
  cert._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl._0_4_ = 1;
LAB_00131ac6:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return (bool)(out_x509_local._7_1_ & 1);
}

Assistant:

bool LoadCertificate(bssl::UniquePtr<X509> *out_x509,
                     bssl::UniquePtr<STACK_OF(X509)> *out_chain,
                     const std::string &file) {
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_file()));
  if (!bio || !BIO_read_filename(bio.get(), file.c_str())) {
    return false;
  }

  out_x509->reset(PEM_read_bio_X509(bio.get(), nullptr, nullptr, nullptr));
  if (!*out_x509) {
    return false;
  }

  out_chain->reset(sk_X509_new_null());
  if (!*out_chain) {
    return false;
  }

  // Keep reading the certificate chain.
  for (;;) {
    bssl::UniquePtr<X509> cert(
        PEM_read_bio_X509(bio.get(), nullptr, nullptr, nullptr));
    if (!cert) {
      break;
    }

    if (!bssl::PushToStack(out_chain->get(), std::move(cert))) {
      return false;
    }
  }

  uint32_t err = ERR_peek_last_error();
  if (ERR_GET_LIB(err) != ERR_LIB_PEM ||
      ERR_GET_REASON(err) != PEM_R_NO_START_LINE) {
    return false;
  }

  ERR_clear_error();
  return true;
}